

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep.cpp
# Opt level: O0

void __thiscall ON_BrepFace::DestroyMesh(ON_BrepFace *this,mesh_type mt)

{
  lock_guard<std::recursive_mutex> local_20;
  lock_guard<std::recursive_mutex> lock;
  mesh_type mt_local;
  ON_BrepFace *this_local;
  
  lock._M_device._4_4_ = mt;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_20,&this->m_pImpl->m_mesh_mutex);
  if (lock._M_device._4_4_ == render_mesh) {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this->m_pImpl);
  }
  else if (lock._M_device._4_4_ == analysis_mesh) {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_pImpl->m_analysis_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  }
  else if (lock._M_device._4_4_ == preview_mesh) {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_pImpl->m_preview_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  }
  else {
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2> *)this->m_pImpl);
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_pImpl->m_analysis_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
    std::__shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->m_pImpl->m_preview_mesh).
                super___shared_ptr<const_ON_Mesh,_(__gnu_cxx::_Lock_policy)2>);
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void ON_BrepFace::DestroyMesh(ON::mesh_type mt)
{
  std::lock_guard<std::recursive_mutex> lock(m_pImpl->m_mesh_mutex);

  switch(mt) {
  case ON::render_mesh:
    m_pImpl->m_render_mesh.reset();
    break;
  case ON::analysis_mesh:
    m_pImpl->m_analysis_mesh.reset();
    break;
  case ON::preview_mesh:
    m_pImpl->m_preview_mesh.reset();
    break;
  default:
    m_pImpl->m_render_mesh.reset();
    m_pImpl->m_analysis_mesh.reset();
    m_pImpl->m_preview_mesh.reset();
    break;
  }
}